

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O3

OldToNew __thiscall
wasm::Debug::LocationUpdater::getCompileUnitBasesForLoc(LocationUpdater *this,size_t offset)

{
  undefined8 in_RAX;
  const_iterator cVar1;
  const_iterator cVar2;
  OldToNew OVar3;
  undefined8 local_28;
  mapped_type index;
  
  local_28._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  local_28._0_4_ = (key_type)offset;
  cVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->locToUnitMap)._M_h,(key_type *)&local_28);
  if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>._M_cur !=
      (__node_type *)0x0) {
    local_28 = CONCAT44(local_28._4_4_,(key_type)offset);
    cVar1 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->locToUnitMap)._M_h,(key_type *)&local_28);
    if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>._M_cur
        == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    local_28 = *(key_type_conflict *)
                ((long)cVar1.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>
                       ._M_cur + 0x10);
    cVar2 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->compileUnitBases)._M_h,&local_28);
    if (cVar2.
        super__Node_iterator_base<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      return *(OldToNew *)
              ((long)cVar2.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_false>
                     ._M_cur + 0x10);
    }
  }
  OVar3.first = 0;
  OVar3.second = 0;
  return OVar3;
}

Assistant:

OldToNew getCompileUnitBasesForLoc(size_t offset) const {
    if (locToUnitMap.count(offset) == 0) {
      // There is no compile unit for this loc. It doesn't matter what we set
      // here.
      return OldToNew{0, 0};
    }
    auto index = locToUnitMap.at(offset);
    auto iter = compileUnitBases.find(index);
    if (iter != compileUnitBases.end()) {
      return iter->second;
    }
    return OldToNew{0, 0};
  }